

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O3

gme_err_t gme_open_data(void *data,long size,Music_Emu **out,int sample_rate)

{
  char *extension_;
  gme_type_t type;
  Music_Emu *this;
  blargg_err_t pcVar1;
  Mem_File_Reader in;
  Mem_File_Reader local_50;
  
  *out = (Music_Emu *)0x0;
  if (3 < size) {
    extension_ = gme_identify_header(data);
    type = gme_identify_extension(extension_);
    if (type != (gme_type_t)0x0) {
      this = gme_new_emu(type,sample_rate);
      if (this == (Music_Emu *)0x0) {
        return "Out of memory";
      }
      Mem_File_Reader::Mem_File_Reader(&local_50,data,size);
      pcVar1 = Gme_File::load(&this->super_Gme_File,(Data_Reader *)&local_50);
      if (pcVar1 != (blargg_err_t)0x0) {
        (*(this->super_Gme_File)._vptr_Gme_File[1])(this);
        return pcVar1;
      }
      *out = this;
      return (gme_err_t)0x0;
    }
  }
  return "Wrong file type for this emulator";
}

Assistant:

BLARGG_EXPORT gme_err_t gme_open_data( void const* data, long size, Music_Emu** out, int sample_rate )
{
	require( (data || !size) && out );
	*out = 0;
	
	gme_type_t file_type = 0;
	if ( size >= 4 )
		file_type = gme_identify_extension( gme_identify_header( data ) );
	if ( !file_type )
		return gme_wrong_file_type;
	
	Music_Emu* emu = gme_new_emu( file_type, sample_rate );
	CHECK_ALLOC( emu );
	
	gme_err_t err = gme_load_data( emu, data, size );
	
	if ( err )
		delete emu;
	else
		*out = emu;
	
	return err;
}